

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateTopKLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ActivationLinear *pAVar3;
  string *psVar4;
  pointer pcVar5;
  NeuralNetworkLayer *pNVar6;
  bool bVar7;
  LogMessage *pLVar8;
  iterator iVar9;
  mapped_type_conflict1 *pmVar10;
  LayerUnion LVar11;
  long lVar12;
  long *plVar13;
  ulong *puVar14;
  size_type *psVar15;
  _Rb_tree_header *p_Var16;
  string err;
  Result r;
  undefined1 local_118 [8];
  _Alloc_hider local_110;
  undefined1 local_108 [40];
  ulong *local_e0;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  NeuralNetworkLayer *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Result::Result((Result *)&local_e0);
  validateInputCount((Result *)local_118,layer,1,2);
  local_e0 = (ulong *)local_118;
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_110);
  bVar7 = Result::good((Result *)&local_e0);
  pcVar5 = local_108 + 8;
  if (local_110._M_p != pcVar5) {
    operator_delete(local_110._M_p,local_108._8_8_ + 1);
  }
  if (bVar7) {
    local_98 = layer;
    validateOutputCount((Result *)local_118,layer,2,2);
    local_e0 = (ulong *)local_118;
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_110);
    bVar7 = Result::good((Result *)&local_e0);
    if (local_110._M_p != pcVar5) {
      operator_delete(local_110._M_p,local_108._8_8_ + 1);
    }
    if (bVar7) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"TopK","");
      this_00 = &this->blobNameToRank;
      validateInputOutputRankEquality((Result *)local_118,local_98,&local_90,this_00);
      local_e0 = (ulong *)local_118;
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_110);
      bVar7 = Result::good((Result *)&local_e0);
      if (local_110._M_p != pcVar5) {
        operator_delete(local_110._M_p,local_108._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pNVar6 = local_98;
      if (bVar7) {
        if ((local_98->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_118,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar8 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_118,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b8,pLVar8);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_118);
        }
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,
                       (key_type *)((pNVar6->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        p_Var16 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar9._M_node == p_Var16) {
LAB_00543fbb:
          if (0 < (pNVar6->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
            if (pNVar6->_oneof_case_[0] == 0x3f7) {
              LVar11 = pNVar6->layer_;
            }
            else {
              LVar11.topk_ = Specification::TopKLayerParams::default_instance();
              if ((pNVar6->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
                google::protobuf::internal::LogMessage::LogMessage
                          ((LogMessage *)local_118,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                           ,0x5ca);
                pLVar8 = google::protobuf::internal::LogMessage::operator<<
                                   ((LogMessage *)local_118,
                                    "CHECK failed: (index) < (current_size_): ");
                google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b8,pLVar8);
                google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_118);
              }
            }
            lVar12 = (long)*(int *)((long)((pNVar6->inputtensor_).super_RepeatedPtrFieldBase.rep_)->
                                          elements[0] + 0x24);
            pAVar3 = ((LVar11.activation_)->NonlinearityType_).linear_;
            if ((SBORROW8((long)pAVar3,-lVar12) !=
                 (long)&(pAVar3->super_MessageLite)._vptr_MessageLite + lVar12 < 0) ||
               (lVar12 <= (long)pAVar3)) {
              std::operator+(&local_b8,
                             "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'"
                             ,(pNVar6->name_).ptr_);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_b8);
              puVar14 = (ulong *)(plVar13 + 2);
              if ((ulong *)*plVar13 == puVar14) {
                local_108._0_8_ = *puVar14;
                local_108._8_8_ = plVar13[3];
                local_118 = (undefined1  [8])local_108;
              }
              else {
                local_108._0_8_ = *puVar14;
                local_118 = (undefined1  [8])*plVar13;
              }
              local_110._M_p = (pointer)plVar13[1];
              *plVar13 = (long)puVar14;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_118);
              if (local_118 == (undefined1  [8])local_108) goto LAB_00544031;
              goto LAB_005442bc;
            }
          }
          Result::Result(__return_storage_ptr__);
        }
        else {
          if ((pNVar6->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_118,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar8 = google::protobuf::internal::LogMessage::operator<<
                               ((LogMessage *)local_118,"CHECK failed: (index) < (current_size_): ")
            ;
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b8,pLVar8);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_118);
          }
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find(&this_00->_M_t,
                         *(key_type **)((pNVar6->output_).super_RepeatedPtrFieldBase.rep_ + 1));
          if ((_Rb_tree_header *)iVar9._M_node == p_Var16) goto LAB_00543fbb;
          if ((pNVar6->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_118,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar8 = google::protobuf::internal::LogMessage::operator<<
                               ((LogMessage *)local_118,"CHECK failed: (index) < (current_size_): ")
            ;
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b8,pLVar8);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_118);
          }
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(this_00,(key_type *)
                                 ((pNVar6->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
          iVar2 = *pmVar10;
          if ((pNVar6->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_118,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar8 = google::protobuf::internal::LogMessage::operator<<
                               ((LogMessage *)local_118,"CHECK failed: (index) < (current_size_): ")
            ;
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b8,pLVar8);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_118);
          }
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(this_00,*(key_type **)
                                  ((pNVar6->output_).super_RepeatedPtrFieldBase.rep_ + 1));
          if (iVar2 == *pmVar10) goto LAB_00543fbb;
          local_110._M_p = (pointer)0x0;
          local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
          psVar4 = (pNVar6->name_).ptr_;
          pcVar5 = (psVar4->_M_dataplus)._M_p;
          local_118 = (undefined1  [8])local_108;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar5,pcVar5 + psVar4->_M_string_length);
          std::operator+(&local_50,"Layer \'",&local_70);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar15 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_b8.field_2._M_allocated_capacity = *psVar15;
            local_b8.field_2._8_8_ = plVar13[3];
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          }
          else {
            local_b8.field_2._M_allocated_capacity = *psVar15;
            local_b8._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_b8._M_string_length = plVar13[1];
          *plVar13 = (long)psVar15;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_118,(string *)&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_118);
          if (local_118 == (undefined1  [8])local_108) goto LAB_00544031;
LAB_005442bc:
          operator_delete((void *)local_118,local_108._0_8_ + 1);
        }
        goto LAB_00544031;
      }
    }
  }
  *(ulong **)__return_storage_ptr__ = local_e0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p == &local_c8) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_c8._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_d8._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
LAB_00544031:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateTopKLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 2)).good()) return r;
    if (!(r = validateOutputCount(layer, 2, 2)).good()) return r;
    if (!(r = validateInputOutputRankEquality(layer, "TopK", blobNameToRank)).good()) return r;

    if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
        blobNameToRank.find(layer.output(1)) != blobNameToRank.end()) {
        if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.output(1))) {
            std::string err;
            err = "Layer '" + std::string(layer.name()) + "' of type 'TopK' expects equal ranks for its input and second output, but they are not equal.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.topk();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}